

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O3

void __thiscall
ModelFlattening_importedUnitsUsingUnitWhichIsAnImportedUnits_Test::
~ModelFlattening_importedUnitsUsingUnitWhichIsAnImportedUnits_Test
          (ModelFlattening_importedUnitsUsingUnitWhichIsAnImportedUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ModelFlattening, importedUnitsUsingUnitWhichIsAnImportedUnits)
{
    const std::string unitsDefinitionsModelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"units_definitions\">\n"
        "  <units name=\"more_mm\">\n"
        "    <unit prefix=\"milli\" units=\"second\"/>\n"
        "  </units>\n"
        "</model>";
    const std::string importModelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"base\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"units_definitions.cellml\">\n"
        "    <units units_ref=\"more_mm\" name=\"more_mm\"/>\n"
        "  </import>\n"
        "  <units name=\"mm_sq\">\n"
        "    <unit units=\"mm\"/>\n"
        "    <unit units=\"more_mm\"/>\n"
        "  </units>\n"
        "  <units name=\"mm\">\n"
        "    <unit prefix=\"milli\" units=\"second\"/>\n"
        "  </units>\n"
        "  <component name=\"base\">\n"
        "    <variable name=\"var1\" units=\"mm_sq\"/>\n"
        "  </component>\n"
        "</model>";
    const std::string modelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"base.cellml\">\n"
        "    <component component_ref=\"base\" name=\"base\"/>\n"
        "  </import>\n"
        "</model>";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <units name=\"mm\">\n"
        "    <unit prefix=\"milli\" units=\"metre\"/>\n"
        "  </units>\n"
        "  <units name=\"mm_sq\">\n"
        "    <unit units=\"mm\"/>\n"
        "    <unit units=\"mm\"/>\n"
        "  </units>\n"
        "  <component name=\"base\">\n"
        "    <variable name=\"var1\" units=\"mm_sq\"/>\n"
        "  </component>\n"
        "</model>\n";

    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();
    auto validator = libcellml::Validator::create();

    auto model = parser->parseModel(modelString);
    auto importModel = parser->parseModel(importModelString);
    auto unitsDefinitionsModel = parser->parseModel(unitsDefinitionsModelString);

    importer->addModel(importModel, "base.cellml");
    importer->addModel(unitsDefinitionsModel, "units_definitions.cellml");

    importer->resolveImports(model, ".");
    EXPECT_TRUE(model->hasUnresolvedImports());

    auto flattenedModel = importer->flattenModel(model);
    EXPECT_EQ(nullptr, flattenedModel);
}